

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void FreeMp3(drmp3 *mp3)

{
  void *pvVar1;
  
  pvVar1 = mp3->pUserData;
  if (pvVar1 != (void *)0x0) {
    drmp3_uninit(mp3);
    mp3->pUserData = (void *)0x0;
    (**(code **)((long)pvVar1 + 0x20))();
    return;
  }
  return;
}

Assistant:

static void
FreeMp3(drmp3 *mp3)
{
    SDL_RWops *rw = (SDL_RWops *) mp3->pUserData;
    if (rw) {
        drmp3_uninit(mp3);
        mp3->pUserData = NULL;
        SDL20_RWclose(rw);
    }
}